

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileTests.cpp
# Opt level: O1

void __thiscall
solitaire::piles::StockPileWithCardsTest_tryPullOutSecondCard_Test::TestBody
          (StockPileWithCardsTest_tryPullOutSecondCard_Test *this)

{
  pointer __src;
  pointer *ppCVar1;
  pointer pCVar2;
  pointer pCVar3;
  void *pvVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer *__ptr;
  char *pcVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Card secondCard;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  pointer local_68;
  AssertHelper local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  _Storage<solitaire::cards::Card,_true> local_50 [2];
  long local_40;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_38;
  Card local_20;
  
  pCVar2 = (this->super_StockPileWithCardsTest).pileCards.
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_20 = pCVar2[1];
  __src = pCVar2 + 2;
  pCVar3 = (this->super_StockPileWithCardsTest).pileCards.
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__src != pCVar3) {
    memmove(pCVar2 + 1,__src,(long)pCVar3 - (long)__src);
  }
  ppCVar1 = &(this->super_StockPileWithCardsTest).pileCards.
             super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  *ppCVar1 = *ppCVar1 + -1;
  (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
      super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_StockPile).super_Archiver._vptr_Archiver[4])();
  (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
      super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_StockPile).super_Archiver._vptr_Archiver[4])();
  local_50[0]._0_4_ =
       (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
           super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_StockPile).super_Archiver._vptr_Archiver[5])();
  local_50[0]._M_value.suit = extraout_var;
  testing::internal::CmpHelperEQ<std::optional<solitaire::cards::Card>,solitaire::cards::Card>
            ((internal *)local_78,"pile->tryPullOutCard()","secondCard",
             (optional<solitaire::cards::Card> *)&local_50[0]._M_value,&local_20);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50[0]._M_value);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x5e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50[0]._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_50[0].field2 != (long *)0x0) {
      (**(code **)(*(long *)local_50[0] + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_78,
             &(this->super_StockPileWithCardsTest).pileCards);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_38,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_78);
  pvVar4 = (void *)CONCAT71(local_78._1_7_,local_78[0]);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_68 - (long)pvVar4);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_78,
             &local_38);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             &local_50[0]._M_value,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_78);
  pvVar4 = (void *)CONCAT71(local_78._1_7_,local_78[0]);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)local_68 - (long)pvVar4);
  }
  (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
      super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_StockPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&local_60,(char *)local_50,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  if ((long *)local_50[0].field2 != (long *)0x0) {
    operator_delete((void *)local_50[0],local_40 - (long)local_50[0]);
  }
  if (local_38.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)local_60.data_ == '\0') {
    testing::Message::Message((Message *)local_78);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50[0]._M_value,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x5f,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_50[0]._M_value,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50[0]._M_value);
    if ((long *)CONCAT71(local_78._1_7_,local_78[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_78._1_7_,local_78[0]) + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_50[0]._0_4_ =
       (*(((this->super_StockPileWithCardsTest).super_EmptyStockPileTest.pile.
           super___shared_ptr<solitaire::piles::StockPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_StockPile).super_Archiver._vptr_Archiver[7])();
  local_50[0]._M_value.suit = extraout_var_00;
  local_60.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<std::optional<unsigned_int>,int>
            ((internal *)local_78,"pile->getSelectedCardIndex()","0",
             (optional<unsigned_int> *)&local_50[0]._M_value,(int *)&local_60);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50[0]._M_value);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/StockPileTests.cpp"
               ,0x60,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50[0]._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_50[0].field2 != (long *)0x0) {
      (**(code **)(*(long *)local_50[0] + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST_F(StockPileWithCardsTest, tryPullOutSecondCard) {
    const auto secondCardIt = std::next(pileCards.begin());
    const auto secondCard = *secondCardIt;
    pileCards.erase(secondCardIt);

    pile->trySelectNextCard();
    pile->trySelectNextCard();

    EXPECT_EQ(pile->tryPullOutCard(), secondCard);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getSelectedCardIndex(), 0);
}